

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  int iVar3;
  Type TVar4;
  PageAllocation *pPVar5;
  size_t sVar6;
  GroupInfo *pGVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  long lVar11;
  
  iVar3 = (this->super_GroupMixin).groupId;
  if (((long)iVar3 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) goto LAB_00f03a13;
    *puVar10 = 0;
  }
  if ((matcher->groupInfos).ptr[iVar3].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf80,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar9) goto LAB_00f03a13;
    *puVar10 = 0;
  }
  TVar4 = *inputOffset;
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  while( true ) {
    if (matcher->stats != (Type)0x0) {
      puVar1 = &matcher->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    if (inputLength <= *inputOffset) break;
    CVar2 = input[*inputOffset];
    if ((ushort)CVar2 < 0x100) {
      bVar9 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
               ((ushort)CVar2 & 0x1f) & 1) != 0;
    }
    else {
      if ((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) break;
      bVar9 = RuntimeCharSet<char16_t>::Get_helper
                        (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
    }
    if (bVar9 == false) break;
    *inputOffset = *inputOffset + 1;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00f03a13;
      *puVar10 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x18;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar3 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 3;
    *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_015597e8;
    *(int *)((long)&pPVar5[2].pageCount + sVar6 + 4) = iVar3;
    Matcher::PushStats(matcher,contStack,input);
  }
  iVar3 = (this->super_GroupMixin).groupId;
  lVar11 = (long)iVar3;
  if ((lVar11 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) {
LAB_00f03a13:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  pGVar7 = (matcher->groupInfos).ptr;
  pGVar7[lVar11].offset = TVar4;
  pGVar7[lVar11].length = *inputOffset - TVar4;
  *instPointer = *instPointer + 0x2e;
  return false;
}

Assistant:

inline bool ChompSetGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && matchSet.Get(input[inputOffset])))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && matchSet.Get(input[inputOffset]))
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }